

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O0

void __thiscall
Temperature_ConversionsUnitPrecise2Unit_Test::~Temperature_ConversionsUnitPrecise2Unit_Test
          (Temperature_ConversionsUnitPrecise2Unit_Test *this)

{
  Temperature_ConversionsUnitPrecise2Unit_Test *this_local;
  
  ~Temperature_ConversionsUnitPrecise2Unit_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Temperature, ConversionsUnitPrecise2Unit)
{
    using namespace units;
    EXPECT_NEAR(
        convert(neg_forty_C, precise::degC, degF),
        neg_forty_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C, precise::degC, K),
        neg_forty_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(neg_forty_C_in_F, precise::degF, degC),
        neg_forty_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C_in_K, precise::K, degC),
        neg_forty_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C_in_K, precise::K, degF),
        neg_forty_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(zero_C, precise::degC, degF),
        zero_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C, precise::degC, K),
        zero_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(zero_C_in_F, precise::degF, degC),
        zero_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C_in_K, precise::K, degC),
        zero_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C_in_K, precise::K, degF),
        zero_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(five_C, precise::degC, degF),
        five_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C, precise::degC, K),
        five_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(five_C_in_F, precise::degF, degC),
        five_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C_in_K, precise::K, degC),
        five_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C_in_K, precise::K, degF),
        five_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(hundred_C, precise::degC, degF),
        hundred_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C, precise::degC, K),
        hundred_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(hundred_C_in_F, precise::degF, degC),
        hundred_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C_in_K, precise::K, degC),
        hundred_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C_in_K, precise::K, degF),
        hundred_C_in_F,
        test::precise_tolerance);
}